

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O2

void __thiscall tst_qpromise_convert::fulfillTAsQVariant(tst_qpromise_convert *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Foo>_> QVar2;
  bool bVar3;
  char cVar4;
  Foo FVar5;
  PromiseData<QVariant> *this_00;
  PrivateShared *pPVar6;
  QPromiseBase<QVariant> *this_01;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data> local_120;
  PromiseResolver<QVariant> resolver;
  QPromise<QVariant> p_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data> local_100;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data> local_f0;
  QPromise<QVariant> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data> local_c0;
  QVariant value;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  QPromiseBase<(anonymous_namespace)::Foo> local_68;
  undefined1 local_58 [24];
  _Invoker_type p_Stack_40;
  Foo local_2c;
  
  local_58._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)local_98,(int *)local_58);
  QtPromise::QPromise<int>::convert<QVariant>((QPromise<int> *)&p);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)local_98);
  local_58._0_8_ = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = (code *)0x0;
  p_Stack_40 = (_Invoker_type)0x2;
  waitForValue<QVariant>((QVariant *)local_98,&p,(QVariant *)local_58);
  QVariant::QVariant(&value,0x2a);
  bVar3 = QTest::qCompare<QVariant,QVariant>
                    ((QVariant *)local_98,&value,"waitForValue(p, QVariant{})","QVariant{42}",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0xaf);
  QVariant::~QVariant(&value);
  QVariant::~QVariant((QVariant *)local_98);
  QVariant::~QVariant((QVariant *)local_58);
  if (bVar3) {
    bVar3 = QtPromisePrivate::PromiseDataBase<QVariant,_void_(const_QVariant_&)>::isFulfilled
                      (&(p.super_QPromiseBase<QVariant>.m_d.d)->
                        super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
    cVar4 = QTest::qVerify(bVar3,"p.isFulfilled()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0xb0);
    QtPromise::QPromiseBase<QVariant>::~QPromiseBase(&p.super_QPromiseBase<QVariant>);
    if (cVar4 == '\0') {
      return;
    }
    local_2c.m_foo = 0x2a;
    QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_68,&local_2c);
    value.d.data.shared = (PrivateShared *)0x0;
    value.d.data._8_8_ = 0;
    value.d._24_8_ =
         std::
         _Function_handler<QVariant_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:605:16)>
         ::_M_invoke;
    value.d.data._16_8_ =
         std::
         _Function_handler<QVariant_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:605:16)>
         ::_M_manager;
    p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001481d0;
    this_00 = (PromiseData<QVariant> *)operator_new(0x68);
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_error.m_data.
    _M_exception_object = (void *)0x0;
    (this_00->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.size = 0;
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.size = 0;
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.d = (Data *)0x0
    ;
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.d = (Data *)0x0
    ;
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_lock = 0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_settled =
         0;
    (this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)
     &(this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData = 0;
    (this_00->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<QVariant>::PromiseData(this_00);
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (this_00 != (PromiseData<QVariant> *)0x0) {
      LOCK();
      pQVar1 = &(this_00->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001488d0;
    p_1.super_QPromiseBase<QVariant>.m_d.d = this_00;
    p.super_QPromiseBase<QVariant>.m_d.d = this_00;
    QtPromisePrivate::PromiseResolver<QVariant>::PromiseResolver(&resolver,&p);
    QtPromise::QPromiseBase<QVariant>::~QPromiseBase(&p.super_QPromiseBase<QVariant>);
    QVar2.d = local_68.m_d.d;
    if (resolver.m_d.d == (Data *)0x0) {
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data>)
           (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_f0.d = (Data *)0x0;
    if (resolver.m_d.d == (Data *)0x0) {
      local_f8.d = (Data *)0x0;
    }
    else {
      LOCK();
      (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_f8 = resolver.m_d.d;
    }
    local_100.d = (Data *)0x0;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((PromiseData<int> *)local_f8.d != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &(((PromiseData<int> *)local_f8.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (((QAtomicInt *)
            &(((PromiseData<int> *)local_f8.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
             _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c0 = resolver.m_d.d;
    local_98._0_8_ = resolver.m_d.d;
    local_98._8_8_ = local_f8.d;
    std::function<QVariant_(const_(anonymous_namespace)::Foo_&)>::function
              ((function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)local_88,
               (function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)&value);
    local_58._16_8_ = 0;
    p_Stack_40 = (_Invoker_type)0x0;
    local_58._0_8_ = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    pPVar6 = (PrivateShared *)operator_new(0x30);
    *(undefined8 *)pPVar6 = local_98._0_8_;
    if ((Data *)local_98._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_98._0_8_ = *(int *)local_98._0_8_ + 1;
      UNLOCK();
    }
    *(undefined8 *)(pPVar6 + 8) = local_98._8_8_;
    if ((PromiseData<int> *)local_98._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)local_98._8_8_ = *(int *)local_98._8_8_ + 1;
      UNLOCK();
    }
    std::function<QVariant_(const_(anonymous_namespace)::Foo_&)>::function
              ((function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)(pPVar6 + 0x10),
               (function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)local_88);
    p_Stack_40 = std::
                 _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_58._16_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    local_58._0_8_ = pPVar6;
    QtPromisePrivate::
    PromiseHandler<(anonymous_namespace)::Foo,std::function<QVariant((anonymous_namespace)::Foo_const&)>,(anonymous_namespace)::Foo_const&>
    ::
    create<QtPromise::QPromiseResolve<QVariant>,QtPromise::QPromiseReject<QVariant>>(std::function<QVariant((anonymous_namespace)::Foo_const&)>const&,QtPromise::QPromiseResolve<QVariant>const&,QtPromise::QPromiseReject<QVariant>const&)
    ::{lambda((anonymous_namespace)::Foo_const&)#1}::~create
              ((_lambda__anonymous_namespace___Foo_const___1_ *)local_98);
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
    addHandler(&(QVar2.d)->
                super_PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
               ,(function<void_(const_(anonymous_namespace)::Foo_&)> *)local_58);
    std::_Function_base::~_Function_base((_Function_base *)local_58);
    QVar2.d = local_68.m_d.d;
    local_120.d = local_f8.d;
    if ((PromiseData<int> *)local_f8.d != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_f8.d)->super_QSharedData)->
        _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (((QAtomicInt *)
            &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_f8.d)->super_QSharedData)->
             _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88._0_8_ = (void *)0x0;
    local_88._8_8_ = 0;
    local_98._0_8_ = (PrivateShared *)0x0;
    local_98._8_8_ = (PromiseData<int> *)0x0;
    local_98._0_8_ = operator_new(8);
    *(Data **)local_98._0_8_ = local_120.d;
    if ((PromiseData<int> *)local_120.d != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_120.d)->super_QSharedData)->
        _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (((QAtomicInt *)
            &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_120.d)->super_QSharedData)->
             _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88._8_8_ =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
         ::_M_invoke;
    local_88._0_8_ =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
         ::_M_manager;
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data>::
    ~QExplicitlySharedDataPointer(&local_120);
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
    addCatcher(&(QVar2.d)->
                super_PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
               ,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_98);
    std::_Function_base::~_Function_base((_Function_base *)local_98);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data>::
    ~QExplicitlySharedDataPointer(&local_f8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data>::
    ~QExplicitlySharedDataPointer(&local_100);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data>::
    ~QExplicitlySharedDataPointer(&local_c0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data>::
    ~QExplicitlySharedDataPointer(&local_f0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001488d0;
    bVar3 = QtPromisePrivate::
            PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
            isPending(&(local_68.m_d.d)->
                       super_PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                     );
    if (!bVar3) {
      QtPromisePrivate::
      PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
      dispatch(&(local_68.m_d.d)->
                super_PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              );
    }
    std::_Function_base::~_Function_base((_Function_base *)&value);
    QtPromise::QPromiseBase<(anonymous_namespace)::Foo>::~QPromiseBase(&local_68);
    p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<QVariant>.m_d.d = (PromiseData<QVariant> *)0x0;
    waitForValue<QVariant>(&value,&p_1,(QVariant *)&p);
    QVariant::~QVariant((QVariant *)&p);
    local_68._vptr_QPromiseBase._0_4_ = 0x2a;
    QVariant::fromValue<(anonymous_namespace)::Foo>
              ((enable_if_t<std::is_copy_constructible_v<(anonymous_namespace)::Foo>,_QVariant> *)&p
               ,(Foo *)&local_68);
    bVar3 = QTest::qCompare<QVariant,QVariant>
                      (&value,(QVariant *)&p,"value","QVariant::fromValue(Foo{42})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                       ,0xba);
    QVariant::~QVariant((QVariant *)&p);
    if (bVar3) {
      FVar5 = qvariant_cast<(anonymous_namespace)::Foo>(&value);
      cVar4 = QTest::qCompare(FVar5.m_foo,0x2a,"value.value<Foo>().m_foo","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                              ,0xbb);
      if (cVar4 != '\0') {
        bVar3 = QtPromisePrivate::PromiseDataBase<QVariant,_void_(const_QVariant_&)>::isFulfilled
                          (&(p_1.super_QPromiseBase<QVariant>.m_d.d)->
                            super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
        QTest::qVerify(bVar3,"p.isFulfilled()","",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                       ,0xbc);
      }
    }
    QVariant::~QVariant(&value);
    this_01 = &p_1.super_QPromiseBase<QVariant>;
  }
  else {
    this_01 = &p.super_QPromiseBase<QVariant>;
  }
  QtPromise::QPromiseBase<QVariant>::~QPromiseBase(this_01);
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsQVariant()
{
    // Primitive type to QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QCOMPARE(waitForValue(p, QVariant{}), QVariant{42});
        QVERIFY(p.isFulfilled());
    }

    // Non-Qt user-defined type to QVariant.
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QVariant value = waitForValue(p, QVariant{});
        QCOMPARE(value, QVariant::fromValue(Foo{42}));
        QCOMPARE(value.value<Foo>().m_foo, 42);
        QVERIFY(p.isFulfilled());
    }
}